

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::LogMessage::Init
          (LogMessage *this,char *file,int line,LogSeverity severity,SendMethod send_method)

{
  char *filename_;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  LogMessageData *pLVar4;
  int *piVar5;
  char *pcVar6;
  ostream *poVar7;
  long lVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  id thread_id_;
  size_t sVar10;
  ulong uVar11;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined1 local_2c8 [8];
  string stacktrace;
  char fileline [128];
  LogMessageInfo local_220;
  char local_1f1;
  native_handle_type local_1f0;
  int local_1e4;
  char local_1dd;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  ios local_1c0 [8];
  ios saved_fmt;
  LogMessageTime local_b0;
  duration local_60;
  time_point now;
  lock_guard<std::mutex> l;
  SendMethod send_method_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  LogMessage *this_local;
  
  this->allocated_ = (LogMessageData *)0x0;
  if ((severity == FATAL) && ((exit_on_dfatal & 1) != 0)) {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&now,(mutex_type *)fatal_msg_lock);
    if ((fatal_msg_exclusive & 1) == 0) {
      this->data_ = (LogMessageData *)fatal_msg_data_shared;
      this->data_->first_fatal_ = false;
    }
    else {
      fatal_msg_exclusive = 0;
      this->data_ = (LogMessageData *)&fatal_msg_data_exclusive;
      this->data_->first_fatal_ = true;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&now);
  }
  else {
    if ((*(byte *)(*in_FS_OFFSET + -0x76f0) & 1) == 0) {
      pLVar4 = (LogMessageData *)operator_new(0x76e8);
      LogMessageData::LogMessageData(pLVar4);
      this->allocated_ = pLVar4;
      this->data_ = this->allocated_;
    }
    else {
      *(undefined1 *)(*in_FS_OFFSET + -0x76f0) = 0;
      lVar8 = *in_FS_OFFSET;
      LogMessageData::LogMessageData((LogMessageData *)(lVar8 + -0x76e8));
      this->data_ = (LogMessageData *)(lVar8 + -0x76e8);
    }
    this->data_->first_fatal_ = false;
  }
  piVar5 = __errno_location();
  this->data_->preserved_errno_ = *piVar5;
  this->data_->severity_ = severity;
  this->data_->line_ = line;
  pLVar4 = this->data_;
  *(undefined8 *)&pLVar4->field_0x76a8 = in_R9;
  pLVar4->send_method_ = send_method;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  (this->data_->field_6).sink_ = (LogSink *)0x0;
  local_60.__r = std::chrono::_V2::system_clock::now();
  LogMessageTime::LogMessageTime(&local_b0,(time_point)local_60.__r);
  memcpy(&this->time_,&local_b0,0x50);
  this->data_->num_chars_to_log_ = 0;
  this->data_->num_chars_to_syslog_ = 0;
  pcVar6 = glog_internal_namespace_::const_basename(file);
  this->data_->basename_ = pcVar6;
  this->data_->fullname_ = file;
  this->data_->has_been_flushed_ = false;
  if (((fLB::FLAGS_log_prefix & 1) != 0) && (line != -1)) {
    std::ios::ios(local_1c0,(streambuf *)0x0);
    stream(this);
    std::ios::copyfmt(local_1c0);
    poVar7 = stream(this);
    std::ios::fill((char)poVar7 + (char)poVar7->_vptr_basic_ostream[-3]);
    pcVar1 = (anonymous_namespace)::custom_prefix_callback;
    if ((anonymous_namespace)::custom_prefix_callback == (code *)0x0) {
      poVar7 = stream(this);
      std::operator<<(poVar7,**(char **)(LogSeverityNames + (ulong)severity * 8));
      if ((fLB::FLAGS_log_year_in_prefix & 1) != 0) {
        poVar7 = stream(this);
        local_1c4 = (int)std::setw(4);
        poVar7 = std::operator<<(poVar7,(_Setw)local_1c4);
        iVar3 = LogMessageTime::year(&this->time_);
        std::ostream::operator<<(poVar7,iVar3 + 0x76c);
      }
      poVar7 = stream(this);
      local_1c8 = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1c8);
      iVar3 = LogMessageTime::month(&this->time_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3 + 1);
      local_1cc = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1cc);
      iVar3 = LogMessageTime::day(&this->time_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      poVar7 = std::operator<<(poVar7,' ');
      local_1d0 = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1d0);
      iVar3 = LogMessageTime::hour(&this->time_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      poVar7 = std::operator<<(poVar7,':');
      local_1d4 = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1d4);
      iVar3 = LogMessageTime::min(&this->time_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      poVar7 = std::operator<<(poVar7,':');
      local_1d8 = (int)std::setw(2);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1d8);
      iVar3 = LogMessageTime::sec(&this->time_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
      poVar7 = std::operator<<(poVar7,".");
      local_1dc = (int)std::setw(6);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1dc);
      lVar8 = LogMessageTime::usec(&this->time_);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,lVar8);
      poVar7 = std::operator<<(poVar7,' ');
      local_1dd = (char)std::setfill<char>(' ');
      poVar7 = std::operator<<(poVar7,local_1dd);
      local_1e4 = (int)std::setw(5);
      poVar7 = std::operator<<(poVar7,(_Setw)local_1e4);
      local_1f0 = (native_handle_type)std::this_thread::get_id();
      pbVar9 = std::operator<<(poVar7,(id)local_1f0);
      local_1f1 = (char)std::setfill<char>('0');
      poVar7 = std::operator<<(pbVar9,local_1f1);
      poVar7 = std::operator<<(poVar7,' ');
      poVar7 = std::operator<<(poVar7,this->data_->basename_);
      poVar7 = std::operator<<(poVar7,':');
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->data_->line_);
      std::operator<<(poVar7,"] ");
    }
    else {
      poVar7 = stream(this);
      pcVar6 = *(char **)(LogSeverityNames + (ulong)severity * 8);
      pLVar4 = this->data_;
      filename_ = pLVar4->basename_;
      thread_id_ = std::this_thread::get_id();
      LogMessageInfo::LogMessageInfo
                (&local_220,pcVar6,filename_,&pLVar4->line_,thread_id_,&this->time_);
      (*pcVar1)(poVar7,&local_220,(anonymous_namespace)::custom_prefix_callback_data);
      poVar7 = stream(this);
      std::operator<<(poVar7," ");
    }
    poVar7 = stream(this);
    std::ios::copyfmt((ios *)((long)&poVar7->_vptr_basic_ostream +
                             (long)poVar7->_vptr_basic_ostream[-3]));
    std::ios::~ios(local_1c0);
  }
  sVar10 = LogStream::pcount(&this->data_->stream_);
  this->data_->num_prefix_chars_ = sVar10;
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) == 0) {
    snprintf(stacktrace.field_2._M_local_buf + 8,0x80,"%s:%d",this->data_->basename_,
             (ulong)(uint)line);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            fLS::FLAGS_log_backtrace_at_buf_abi_cxx11_,
                            stacktrace.field_2._M_local_buf + 8);
    if (bVar2) {
      std::__cxx11::string::string((string *)local_2c8);
      glog_internal_namespace_::DumpStackTraceToString((string *)local_2c8);
      poVar7 = stream(this);
      poVar7 = std::operator<<(poVar7," (stacktrace:\n");
      poVar7 = std::operator<<(poVar7,(string *)local_2c8);
      std::operator<<(poVar7,") ");
      std::__cxx11::string::~string((string *)local_2c8);
    }
  }
  return;
}

Assistant:

void LogMessage::Init(const char* file, int line, LogSeverity severity,
                      void (LogMessage::*send_method)()) {
  allocated_ = nullptr;
  if (severity != GLOG_FATAL || !exit_on_dfatal) {
#ifdef GLOG_THREAD_LOCAL_STORAGE
    // No need for locking, because this is thread local.
    if (thread_data_available) {
      thread_data_available = false;
      data_ = new (&thread_msg_data) LogMessageData;
    } else {
      allocated_ = new LogMessageData();
      data_ = allocated_;
    }
#else   // !defined(GLOG_THREAD_LOCAL_STORAGE)
    allocated_ = new LogMessageData();
    data_ = allocated_;
#endif  // defined(GLOG_THREAD_LOCAL_STORAGE)
    data_->first_fatal_ = false;
  } else {
    std::lock_guard<std::mutex> l{fatal_msg_lock};
    if (fatal_msg_exclusive) {
      fatal_msg_exclusive = false;
      data_ = &fatal_msg_data_exclusive;
      data_->first_fatal_ = true;
    } else {
      data_ = &fatal_msg_data_shared;
      data_->first_fatal_ = false;
    }
  }

  data_->preserved_errno_ = errno;
  data_->severity_ = severity;
  data_->line_ = line;
  data_->send_method_ = send_method;
  data_->sink_ = nullptr;
  data_->outvec_ = nullptr;

  const auto now = std::chrono::system_clock::now();
  time_ = LogMessageTime(now);

  data_->num_chars_to_log_ = 0;
  data_->num_chars_to_syslog_ = 0;
  data_->basename_ = const_basename(file);
  data_->fullname_ = file;
  data_->has_been_flushed_ = false;

  // If specified, prepend a prefix to each line.  For example:
  //    I20201018 160715 f5d4fbb0 logging.cc:1153]
  //    (log level, GMT year, month, date, time, thread_id, file basename, line)
  // We exclude the thread_id for the default thread.
  if (FLAGS_log_prefix && (line != kNoLogPrefix)) {
    std::ios saved_fmt(nullptr);
    saved_fmt.copyfmt(stream());
    stream().fill('0');
    if (custom_prefix_callback == nullptr) {
      stream() << LogSeverityNames[severity][0];
      if (FLAGS_log_year_in_prefix) {
        stream() << setw(4) << 1900 + time_.year();
      }
      stream() << setw(2) << 1 + time_.month() << setw(2) << time_.day() << ' '
               << setw(2) << time_.hour() << ':' << setw(2) << time_.min()
               << ':' << setw(2) << time_.sec() << "." << setw(6)
               << time_.usec() << ' ' << setfill(' ') << setw(5)
               << std::this_thread::get_id() << setfill('0') << ' '
               << data_->basename_ << ':' << data_->line_ << "] ";
    } else {
      custom_prefix_callback(
          stream(),
          LogMessageInfo(LogSeverityNames[severity], data_->basename_,
                         data_->line_, std::this_thread::get_id(), time_),
          custom_prefix_callback_data);
      stream() << " ";
    }
    stream().copyfmt(saved_fmt);
  }
  data_->num_prefix_chars_ = data_->stream_.pcount();

  if (!FLAGS_log_backtrace_at.empty()) {
    char fileline[128];
    std::snprintf(fileline, sizeof(fileline), "%s:%d", data_->basename_, line);
#ifdef HAVE_STACKTRACE
    if (FLAGS_log_backtrace_at == fileline) {
      string stacktrace;
      DumpStackTraceToString(&stacktrace);
      stream() << " (stacktrace:\n" << stacktrace << ") ";
    }
#endif
  }
}